

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcDuctFittingType::IfcDuctFittingType(IfcDuctFittingType *this)

{
  *(undefined ***)&this->field_0x1e0 = &PTR__Object_008d12a0;
  *(undefined8 *)&this->field_0x1e8 = 0;
  *(char **)&this->field_0x1f0 = "IfcDuctFittingType";
  Schema_2x3::IfcFlowFittingType::IfcFlowFittingType
            (&this->super_IfcFlowFittingType,&PTR_construction_vtable_24__0090b940);
  *(undefined8 *)&(this->super_IfcFlowFittingType).field_0x1b8 = 0;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x90b7c0;
  *(undefined8 *)&this->field_0x1e0 = 0x90b928;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0x90b7e8;
  (this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x90b810;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x90b838;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x90b860;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0x90b888;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0x90b8b0;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0x90b8d8;
  *(undefined8 *)&(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.field_0x1b0
       = 0x90b900;
  *(undefined1 **)&(this->super_IfcFlowFittingType).field_0x1c0 = &this->field_0x1d0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  this->field_0x1d0 = 0;
  return;
}

Assistant:

IfcDuctFittingType() : Object("IfcDuctFittingType") {}